

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.c
# Opt level: O0

void destroy_screenshot(SCREENSHOT *ss)

{
  void *in_RDI;
  
  free(*(void **)((long)in_RDI + 8));
  *(undefined8 *)((long)in_RDI + 8) = 0;
  free(*(void **)((long)in_RDI + 0x10));
  *(undefined8 *)((long)in_RDI + 0x10) = 0;
  free(in_RDI);
  return;
}

Assistant:

void destroy_screenshot(SCREENSHOT * ss)
{
   free(ss->name);
   ss->name = NULL;
   free(ss->ext);
   ss->ext = NULL;
   free(ss);
   ss = NULL;
}